

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.c
# Opt level: O0

long tutil_tvdiff(timeval newer,timeval older)

{
  timeval older_local;
  timeval newer_local;
  
  return (newer.tv_sec - older.tv_sec) * 1000 + (newer.tv_usec - older.tv_usec) / 1000;
}

Assistant:

long tutil_tvdiff(struct timeval newer, struct timeval older)
{
  return (long)(newer.tv_sec-older.tv_sec)*1000+
    (long)(newer.tv_usec-older.tv_usec)/1000;
}